

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void build_masked_compound
               (uint8_t *dst,int dst_stride,uint8_t *src0,int src0_stride,uint8_t *src1,
               int src1_stride,INTERINTER_COMPOUND_DATA *comp_data,BLOCK_SIZE sb_type,int h,int w)

{
  byte bVar1;
  uint8_t *puVar2;
  uint32_t in_ECX;
  uint8_t *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  bool bVar3;
  byte in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  uint8_t *mask;
  int subw;
  int subh;
  INTERINTER_COMPOUND_DATA *in_stack_ffffffffffffff68;
  
  bVar1 = ""[in_stack_00000010];
  bVar3 = 2 << (""[in_stack_00000010] & 0x1f) == in_stack_00000020;
  puVar2 = av1_get_compound_type_mask(in_stack_ffffffffffffff68,BLOCK_4X4);
  (*aom_blend_a64_mask)
            (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,puVar2,
             (uint32_t)block_size_wide[in_stack_00000010],in_stack_00000020,in_stack_00000018,
             SUB14(bVar3,0),SUB14(2 << (bVar1 & 0x1f) == in_stack_00000018,0));
  return;
}

Assistant:

static void build_masked_compound(
    uint8_t *dst, int dst_stride, const uint8_t *src0, int src0_stride,
    const uint8_t *src1, int src1_stride,
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE sb_type, int h,
    int w) {
  // Derive subsampling from h and w passed in. May be refactored to
  // pass in subsampling factors directly.
  const int subh = (2 << mi_size_high_log2[sb_type]) == h;
  const int subw = (2 << mi_size_wide_log2[sb_type]) == w;
  const uint8_t *mask = av1_get_compound_type_mask(comp_data, sb_type);
  aom_blend_a64_mask(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                     mask, block_size_wide[sb_type], w, h, subw, subh);
}